

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  ostream *poVar1;
  ColourImpl *pCVar2;
  bool bVar3;
  size_type sVar4;
  string expr;
  string local_38;
  
  bVar3 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar3) {
    poVar1 = this->stream;
    pCVar2 = this->colourImpl;
    (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," for: ",6);
    (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_38,this->result);
    if (local_38._M_string_length == 0) {
      local_38._M_string_length = 0;
    }
    else {
      sVar4 = 0;
      do {
        if (local_38._M_dataplus._M_p[sVar4] == '\n') {
          local_38._M_dataplus._M_p[sVar4] = ' ';
        }
        sVar4 = sVar4 + 1;
      } while (local_38._M_string_length != sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (this->stream,local_38._M_dataplus._M_p,local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    stream << colourImpl->guardColour( tapDimColour ) << " for: ";

                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }